

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O0

const_dag_iterator * __thiscall
spvtools::opt::SENode::graph_cend(const_dag_iterator *__return_storage_ptr__,SENode *this)

{
  SENode *this_local;
  
  TreeDFIterator<const_spvtools::opt::SENode>::TreeDFIterator(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const_dag_iterator graph_cend() const { return const_dag_iterator(); }